

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilayer_metadata.cc
# Opt level: O0

bool libaom_examples::anon_unknown_0::validate_layer
               (LayerMetadata *layer,bool layer_has_alpha,bool layer_has_depth)

{
  byte in_DL;
  byte in_SIL;
  int *in_RDI;
  bool local_19;
  bool local_13;
  bool local_1;
  
  local_13 = false;
  if (*in_RDI == 5) {
    local_13 = 1 < in_RDI[4];
  }
  if ((bool)(in_SIL & 1) == local_13) {
    local_19 = false;
    if (*in_RDI == 6) {
      local_19 = 1 < in_RDI[4];
    }
    if ((bool)(in_DL & 1) == local_19) {
      local_1 = true;
    }
    else {
      fprintf(_stderr,
              "Error: depth info must be set if and only if layer_type is %d and layer_metadata_scpoe is >= %d\n"
              ,6,2);
      local_1 = false;
    }
  }
  else {
    fprintf(_stderr,
            "Error: alpha info must be set if and only if layer_type is %d and layer_metadata_scpoe is >= %d\n"
            ,5,2);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool validate_layer(const LayerMetadata &layer, bool layer_has_alpha,
                    bool layer_has_depth) {
  if (layer_has_alpha != (layer.layer_type == MULTILAYER_LAYER_TYPE_ALPHA &&
                          layer.layer_metadata_scope >= SCOPE_GLOBAL)) {
    fprintf(stderr,
            "Error: alpha info must be set if and only if layer_type is "
            "%d and layer_metadata_scpoe is >= %d\n",
            MULTILAYER_LAYER_TYPE_ALPHA, SCOPE_GLOBAL);
    return false;
  }
  if (layer_has_depth != (layer.layer_type == MULTILAYER_LAYER_TYPE_DEPTH &&
                          layer.layer_metadata_scope >= SCOPE_GLOBAL)) {
    fprintf(stderr,
            "Error: depth info must be set if and only if layer_type is "
            "%d and layer_metadata_scpoe is >= %d\n",
            MULTILAYER_LAYER_TYPE_DEPTH, SCOPE_GLOBAL);
    return false;
  }
  return true;
}